

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O1

void __thiscall xLearn::Model::set_value(Model *this)

{
  real_t *prVar1;
  float fVar2;
  uint uVar3;
  real_t *prVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  uint uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  long lVar32;
  uint uVar33;
  index_t iVar34;
  float *pfVar35;
  ushort uVar36;
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  float fVar43;
  double dVar44;
  undefined1 auVar45 [16];
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM6_Qb;
  default_random_engine generator;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  local_38._M_x = 1;
  uVar27 = this->param_num_w_;
  if (uVar27 != 0) {
    prVar4 = this->param_w_;
    uVar28 = this->aux_size_;
    uVar30 = 0;
    uVar31 = 1;
    do {
      prVar4[uVar30] = 0.0;
      lVar32 = (ulong)uVar28 - 1;
      uVar33 = uVar31;
      if (1 < uVar28) {
        do {
          prVar4[uVar33] = 1.0;
          uVar33 = uVar33 + 1;
          lVar32 = lVar32 + -1;
        } while (lVar32 != 0);
      }
      uVar30 = uVar30 + uVar28;
      uVar31 = uVar31 + uVar28;
    } while (uVar30 < uVar27);
  }
  prVar4 = this->param_b_;
  *prVar4 = 0.0;
  uVar27 = this->aux_size_;
  if (1 < (ulong)uVar27) {
    auVar37 = vpbroadcastq_avx512f();
    uVar29 = 0;
    auVar38 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar40 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    do {
      auVar41 = vpbroadcastq_avx512f();
      auVar42 = vporq_avx512f(auVar41,auVar38);
      auVar41 = vporq_avx512f(auVar41,auVar39);
      uVar19 = vpcmpuq_avx512f(auVar41,auVar37,2);
      uVar20 = vpcmpuq_avx512f(auVar42,auVar37,2);
      bVar24 = (byte)uVar20;
      uVar36 = CONCAT11(bVar24,(byte)uVar19);
      prVar1 = prVar4 + uVar29 + 1;
      bVar5 = (bool)((byte)uVar19 & 1);
      bVar6 = (bool)((byte)(uVar36 >> 1) & 1);
      bVar7 = (bool)((byte)(uVar36 >> 2) & 1);
      bVar8 = (bool)((byte)(uVar36 >> 3) & 1);
      bVar9 = (bool)((byte)(uVar36 >> 4) & 1);
      bVar10 = (bool)((byte)(uVar36 >> 5) & 1);
      bVar11 = (bool)((byte)(uVar36 >> 6) & 1);
      bVar12 = (bool)((byte)(uVar36 >> 7) & 1);
      bVar13 = (bool)(bVar24 >> 1 & 1);
      bVar14 = (bool)(bVar24 >> 2 & 1);
      bVar15 = (bool)(bVar24 >> 3 & 1);
      bVar16 = (bool)(bVar24 >> 4 & 1);
      bVar17 = (bool)(bVar24 >> 5 & 1);
      bVar18 = (bool)(bVar24 >> 6 & 1);
      *prVar1 = (real_t)((uint)bVar5 * auVar40._0_4_ | (uint)!bVar5 * (int)*prVar1);
      prVar1[1] = (real_t)((uint)bVar6 * auVar40._4_4_ | (uint)!bVar6 * (int)prVar1[1]);
      prVar1[2] = (real_t)((uint)bVar7 * auVar40._8_4_ | (uint)!bVar7 * (int)prVar1[2]);
      prVar1[3] = (real_t)((uint)bVar8 * auVar40._12_4_ | (uint)!bVar8 * (int)prVar1[3]);
      prVar1[4] = (real_t)((uint)bVar9 * auVar40._16_4_ | (uint)!bVar9 * (int)prVar1[4]);
      prVar1[5] = (real_t)((uint)bVar10 * auVar40._20_4_ | (uint)!bVar10 * (int)prVar1[5]);
      prVar1[6] = (real_t)((uint)bVar11 * auVar40._24_4_ | (uint)!bVar11 * (int)prVar1[6]);
      prVar1[7] = (real_t)((uint)bVar12 * auVar40._28_4_ | (uint)!bVar12 * (int)prVar1[7]);
      prVar1[8] = (real_t)((uint)(bVar24 & 1) * auVar40._32_4_ |
                          (uint)!(bool)(bVar24 & 1) * (int)prVar1[8]);
      prVar1[9] = (real_t)((uint)bVar13 * auVar40._36_4_ | (uint)!bVar13 * (int)prVar1[9]);
      prVar1[10] = (real_t)((uint)bVar14 * auVar40._40_4_ | (uint)!bVar14 * (int)prVar1[10]);
      prVar1[0xb] = (real_t)((uint)bVar15 * auVar40._44_4_ | (uint)!bVar15 * (int)prVar1[0xb]);
      prVar1[0xc] = (real_t)((uint)bVar16 * auVar40._48_4_ | (uint)!bVar16 * (int)prVar1[0xc]);
      prVar1[0xd] = (real_t)((uint)bVar17 * auVar40._52_4_ | (uint)!bVar17 * (int)prVar1[0xd]);
      prVar1[0xe] = (real_t)((uint)bVar18 * auVar40._56_4_ | (uint)!bVar18 * (int)prVar1[0xe]);
      prVar1[0xf] = (real_t)((uint)(bVar24 >> 7) * auVar40._60_4_ |
                            (uint)!(bool)(bVar24 >> 7) * (int)prVar1[0xf]);
      uVar29 = uVar29 + 0x10;
    } while (((ulong)uVar27 + 0xe & 0xfffffffffffffff0) != uVar29);
  }
  iVar25 = std::__cxx11::string::compare((char *)this);
  if (iVar25 == 0) {
    iVar34 = this->num_K_;
    auVar45._8_8_ = in_XMM6_Qb;
    auVar45._0_8_ = in_XMM6_Qa;
    auVar45 = vcvtusi2sd_avx512f(auVar45,iVar34);
    if (auVar45._0_8_ < 0.0) {
      dVar44 = sqrt(auVar45._0_8_);
    }
    else {
      auVar45 = vsqrtsd_avx(auVar45,auVar45);
      dVar44 = auVar45._0_8_;
    }
    if (this->num_feat_ != 0) {
      auVar23._8_8_ = in_XMM6_Qb;
      auVar23._0_8_ = in_XMM6_Qa;
      auVar45 = vcvtusi2ss_avx512f(auVar23,iVar34);
      auVar45 = ZEXT416((uint)(auVar45._0_4_ * 0.25));
      auVar45 = vroundss_avx(auVar45,auVar45,10);
      iVar25 = vcvttss2usi_avx512f(auVar45);
      uVar27 = iVar25 * 4;
      fVar2 = this->scale_;
      pfVar35 = this->param_v_;
      uVar28 = 0;
      do {
        iVar34 = this->num_K_;
        if (iVar34 != 0) {
          uVar30 = 0;
          do {
            fVar43 = std::
                     generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                               (&local_38);
            *pfVar35 = (fVar43 + 0.0) * (float)((1.0 / dVar44) * (double)fVar2);
            uVar30 = uVar30 + 1;
            pfVar35 = pfVar35 + 1;
            iVar34 = this->num_K_;
          } while (uVar30 < iVar34);
        }
        if (iVar34 < uVar27) {
          memset(pfVar35,0,(ulong)(~iVar34 + uVar27) * 4 + 4);
          pfVar35 = pfVar35 + (ulong)(~iVar34 + uVar27) + 1;
        }
        if (uVar27 < this->aux_size_ * uVar27) {
          iVar26 = (this->aux_size_ * 4 + -4) * iVar25;
          do {
            *pfVar35 = 1.0;
            pfVar35 = pfVar35 + 1;
            iVar26 = iVar26 + -1;
          } while (iVar26 != 0);
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 < this->num_feat_);
    }
  }
  else {
    iVar25 = std::__cxx11::string::compare((char *)this);
    if (iVar25 == 0) {
      iVar34 = this->num_K_;
      pfVar35 = this->param_v_;
      auVar21._8_8_ = in_XMM6_Qb;
      auVar21._0_8_ = in_XMM6_Qa;
      auVar45 = vcvtusi2sd_avx512f(auVar21,iVar34);
      if (auVar45._0_8_ < 0.0) {
        dVar44 = sqrt(auVar45._0_8_);
      }
      else {
        auVar45 = vsqrtsd_avx(auVar45,auVar45);
        dVar44 = auVar45._0_8_;
      }
      if (this->num_feat_ != 0) {
        auVar22._8_8_ = in_XMM6_Qb;
        auVar22._0_8_ = in_XMM6_Qa;
        auVar45 = vcvtusi2ss_avx512f(auVar22,iVar34);
        auVar45 = ZEXT416((uint)(auVar45._0_4_ * 0.25));
        auVar45 = vroundss_avx(auVar45,auVar45,10);
        iVar25 = vcvttss2usi_avx512f(auVar45);
        fVar2 = this->scale_;
        uVar27 = 0;
        do {
          if (this->num_field_ != 0) {
            uVar28 = 0;
            do {
              if (iVar25 << 2 != 0) {
                uVar30 = 0;
                uVar33 = 4;
                uVar31 = uVar30;
                do {
                  do {
                    fVar43 = 0.0;
                    if (uVar30 < this->num_K_) {
                      fVar43 = std::
                               generate_canonical<float,24ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                                         (&local_38);
                      fVar43 = (fVar43 + 0.0) * (float)((1.0 / dVar44) * (double)fVar2);
                    }
                    *pfVar35 = fVar43;
                    uVar3 = this->aux_size_;
                    if (1 < (ulong)uVar3) {
                      uVar29 = 4;
                      do {
                        pfVar35[uVar29 & 0xffffffff] = 1.0;
                        uVar29 = uVar29 + 4;
                      } while ((ulong)uVar3 << 2 != uVar29);
                    }
                    pfVar35 = pfVar35 + 1;
                    uVar30 = uVar30 + 1;
                  } while (uVar30 != uVar33);
                  uVar30 = uVar31 + 4;
                  pfVar35 = pfVar35 + (this->aux_size_ * 4 - 4);
                  uVar33 = uVar33 + 4;
                  uVar31 = uVar30;
                } while (uVar30 < (uint)(iVar25 << 2));
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 < this->num_field_);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 < this->num_feat_);
      }
    }
  }
  return;
}

Assistant:

void Model::set_value() {
  // Use distribution to transform the random unsigned
  // int generated by gen into a float in [(0.0, 1.0) * coef]
  std::default_random_engine generator;
  std::uniform_real_distribution<real_t> dis(0.0, 1.0);
  /*********************************************************
   *  Initialize linear and bias term                      *
   *********************************************************/
  for (index_t i = 0; i < param_num_w_; i += aux_size_) {
    param_w_[i] = 0.0;        /* model */
    for (index_t j = 1; j < aux_size_; ++j) {
      param_w_[i+j] = 1.0;    /* gradient cache */
    }
  }
  param_b_[0] = 0.0;      /* model */
  for (index_t j = 1; j < aux_size_; ++j) {
    param_b_[j] = 1.0;    /* gradient cache */
  }
  /*********************************************************
   *  Initialize latent factor for fm                      *
   *********************************************************/
  if (score_func_.compare("fm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t coef = 1.0f / sqrt(num_K_) * scale_;
    real_t* w = param_v_;
    for (index_t j = 0; j < num_feat_; ++j) {
      for(index_t d = 0; d < num_K_; d++, w++) {
        *w = coef * dis(generator);  /* model */
      }
      for(index_t d = num_K_; d < k_aligned; d++, w++) {
        *w = 0;  /* Beyond aligned number */
      }
      for(index_t d = k_aligned; d < aux_size_*k_aligned; d++, w++) {
        *w = 1.0;  /* gradient cache */
      }
    }
  }
  /*********************************************************
   *  Initialize latent factor for ffm                     *
   *********************************************************/
  else if (score_func_.compare("ffm") == 0) {
    index_t k_aligned = get_aligned_k();
    real_t* w = param_v_;
    real_t coef = 1.0f / sqrt(num_K_) * scale_;
    for (index_t j = 0; j < num_feat_; ++j) {
      for (index_t f = 0; f < num_field_; ++f) {
        for (index_t d = 0; d < k_aligned; ) {
          for (index_t s = 0; s < kAlign; s++, w++, d++) {
            w[0] = (d < num_K_) ? coef * dis(generator) : 0.0; /* model */
            for (index_t j = 1; j < aux_size_; ++j) {
              w[kAlign * j] = 1.0; /* gradient cache */
            }
          }
          w += (aux_size_-1) * kAlign;
        }
      }
    }
  }
}